

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderVertexSpacing.cpp
# Opt level: O1

_tess_edges * __thiscall
glcts::TessellationShaderVertexSpacing::getEdgesForIsolinesTessellation
          (_tess_edges *__return_storage_ptr__,TessellationShaderVertexSpacing *this,_run *run)

{
  pointer *pp_Var1;
  pointer pcVar2;
  iterator __position;
  __normal_iterator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian_*,_std::vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>_>
  __first;
  __normal_iterator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian_*,_std::vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>_>
  __last;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  _tess_edge *edge;
  pointer p_Var6;
  float fVar7;
  _tess_coordinate_cartesian new_item;
  _tess_edge new_edge;
  _tess_coordinate_cartesian local_80;
  value_type local_78;
  float local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  (__return_storage_ptr__->
  super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_edge,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_edge>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_edge,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_edge>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_edge,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_edge>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (run->n_vertices != 0) {
    uVar4 = 0;
    do {
      pcVar2 = (run->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar5 = (ulong)(uint)((int)uVar4 * 3);
      local_80.y = *(float *)(pcVar2 + uVar5 * 4 + 4);
      local_80.x = *(float *)(pcVar2 + uVar5 * 4);
      for (p_Var6 = (__return_storage_ptr__->
                    super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_edge,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_edge>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          p_Var6 != (__return_storage_ptr__->
                    super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_edge,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_edge>_>
                    )._M_impl.super__Vector_impl_data._M_finish; p_Var6 = p_Var6 + 1) {
        fVar7 = ((p_Var6->points).
                 super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
                 ._M_impl.super__Vector_impl_data._M_start)->y - *(float *)(pcVar2 + uVar5 * 4 + 4);
        local_48 = -fVar7;
        if (-fVar7 <= fVar7) {
          local_48 = fVar7;
        }
        uStack_44 = 0x80000000;
        uStack_40 = 0x80000000;
        uStack_3c = 0x80000000;
        if (local_48 < 0.001) {
          __position._M_current =
               (p_Var6->points).
               super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (p_Var6->points).
              super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>>
            ::
            _M_realloc_insert<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian_const&>
                      ((vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>>
                        *)p_Var6,__position,&local_80);
          }
          else {
            *__position._M_current = local_80;
            pp_Var1 = &(p_Var6->points).
                       super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *pp_Var1 = *pp_Var1 + 1;
          }
          if (local_48 < 0.001) break;
        }
      }
      if (p_Var6 == (__return_storage_ptr__->
                    super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_edge,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_edge>_>
                    )._M_impl.super__Vector_impl_data._M_finish) {
        local_78.points.
        super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_78.points.
        super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_78.points.
        super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_78.edge_length = 1.0;
        local_78.outermost_tess_level = run->outer[1];
        local_78.tess_level = local_78.outermost_tess_level;
        std::
        vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>>
        ::
        _M_realloc_insert<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian_const&>
                  ((vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>>
                    *)&local_78,(iterator)0x0,&local_80);
        std::
        vector<glcts::TessellationShaderVertexSpacing::_tess_edge,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_edge>_>
        ::push_back(__return_storage_ptr__,&local_78);
        if (local_78.points.
            super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_78.points.
                          super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_78.points.
                                super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_78.points.
                                super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < run->n_vertices);
  }
  p_Var6 = (__return_storage_ptr__->
           super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_edge,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_edge>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (p_Var6 != (__return_storage_ptr__->
                super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_edge,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_edge>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
    do {
      __first._M_current =
           (p_Var6->points).
           super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
           ._M_impl.super__Vector_impl_data._M_start;
      __last._M_current =
           (p_Var6->points).
           super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__first._M_current != __last._M_current) {
        uVar4 = (long)__last._M_current - (long)__first._M_current >> 3;
        lVar3 = 0x3f;
        if (uVar4 != 0) {
          for (; uVar4 >> lVar3 == 0; lVar3 = lVar3 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian*,std::vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian)>>
                  (__first,__last,(ulong)(((uint)lVar3 ^ 0x3f) * 2) ^ 0x7e,
                   (_Iter_comp_iter<bool_(*)(glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian)>
                    )0xcd5c60);
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian*,std::vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian)>>
                  (__first,__last,
                   (_Iter_comp_iter<bool_(*)(glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian)>
                    )0xcd5c60);
      }
      p_Var6 = p_Var6 + 1;
    } while (p_Var6 != (__return_storage_ptr__->
                       super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_edge,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_edge>_>
                       )._M_impl.super__Vector_impl_data._M_finish);
  }
  return __return_storage_ptr__;
}

Assistant:

TessellationShaderVertexSpacing::_tess_edges TessellationShaderVertexSpacing::getEdgesForIsolinesTessellation(
	const _run& run)
{
	_tess_edges result;

	/* First convert the array data to a vector of edges, where each edge
	 * is a vector of points with the same V component. After this is done,
	 * points for each edge need to be sorted by U component.
	 */
	for (unsigned int n_vertex = 0; n_vertex < run.n_vertices; ++n_vertex)
	{
		/* Isolines are simple - we only need to create a new edge per each unique height */
		const float*			   coordinate = (const float*)(&run.data[0]) + 3 /* components */ * n_vertex;
		_tess_coordinate_cartesian new_item;

		new_item.x = coordinate[0];
		new_item.y = coordinate[1];

		/* Is V recognized? */
		_tess_edges_iterator edges_iterator;

		for (edges_iterator = result.begin(); edges_iterator != result.end(); edges_iterator++)
		{
			_tess_edge& edge = *edges_iterator;

			/* Each edge uses the same Y component, so we only need to check the first entry */
			if (de::abs(edge.points[0].y - coordinate[1]) < epsilon)
			{
				/* Add the new point to the vector */
				edge.points.push_back(new_item);

				break;
			}
		} /* for (all edges) */

		if (edges_iterator == result.end())
		{
			/* New edge starts at this point.
			 *
			 * Note that outermost tessellation level does not apply to this
			 * primitive mode.
			 **/
			_tess_edge new_edge(run.outer[1], run.outer[1], 1.0f);

			new_edge.points.push_back(new_item);

			result.push_back(new_edge);
		}
	} /* for (all vertices) */

	/* For each edge, sort the points by U coordinate */
	for (_tess_edges_iterator edges_iterator = result.begin(); edges_iterator != result.end(); ++edges_iterator)
	{
		_tess_edge_points& edge_points = edges_iterator->points;

		std::sort(edge_points.begin(), edge_points.end(), compareEdgeByX);
	}

	/* Done */
	return result;
}